

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O0

void update_cursor(void)

{
  byte bVar1;
  ushort uVar2;
  uint local_c;
  ushort local_a;
  uint cursor_wid;
  uint cursor_add;
  
  if (teletext != '\0') {
    uVar2 = (ushort)crt_regs[0xe] * 0x100 + (ushort)crt_regs[0xf] ^ 0x2000;
    local_a = uVar2 + 0x7400;
    if (local_a < screen_start) {
      local_a = uVar2 + 0x7800;
    }
    gotoxy((ushort)(local_a - screen_start) % 0x28 + 1,(ushort)(local_a - screen_start) / 0x28 + 1);
    return;
  }
  local_a = ((ushort)crt_regs[0xe] * 0x100 + (ushort)crt_regs[0xf]) * 8;
  if (0x7fff < local_a) {
    local_a = local_a - (-0x8000 - ram_screen_start);
  }
  bVar1 = vid_con_reg & 0x60;
  if ((vid_con_reg & 0x60) == 0) {
    local_c = 1;
  }
  else {
    if (bVar1 == 0x20) {
      puts("Invalid Cursor");
      exit(1);
    }
    if (bVar1 == 0x40) {
      local_c = 2;
    }
    else if (bVar1 == 0x60) {
      local_c = 4;
    }
  }
  if (update_cursor::old_cursor_wid != 1) {
    if (update_cursor::old_cursor_wid != 2) {
      if (update_cursor::old_cursor_wid != 4) goto LAB_00110810;
      (*screen_byte_P)(RAM[(int)(update_cursor::old_cursor_add + 0x1f)],
                       update_cursor::old_cursor_add + 0x1f);
      (*screen_byte_P)(RAM[(int)(update_cursor::old_cursor_add + 0x17)],
                       update_cursor::old_cursor_add + 0x17);
    }
    (*screen_byte_P)(RAM[(int)(update_cursor::old_cursor_add + 0xf)],
                     update_cursor::old_cursor_add + 0xf);
  }
  (*screen_byte_P)(RAM[(int)(update_cursor::old_cursor_add + 7)],update_cursor::old_cursor_add + 7);
LAB_00110810:
  if (local_c != 1) {
    if (local_c != 2) {
      if (local_c != 4) {
        update_cursor::old_cursor_add = local_a;
        update_cursor::old_cursor_wid = local_c;
        return;
      }
      (*screen_byte_P)(0xff,local_a + 0x1f);
      (*screen_byte_P)(0xff,local_a + 0x17);
    }
    (*screen_byte_P)(0xff,local_a + 0xf);
  }
  (*screen_byte_P)(0xff,local_a + 7);
  update_cursor::old_cursor_wid = local_c;
  update_cursor::old_cursor_add = local_a;
  return;
}

Assistant:

void update_cursor(void) {
    uint cursor_add;                   // cursor address
    uint cursor_wid;                   // cursor width in bytes
    static uint old_cursor_add;        // static variable to hold the
    static uint old_cursor_wid;        // previous cursor data,
    // so that it may be erased

    if (teletext) {                    // if in teletext mode
        cursor_add = crt_regs[14] * 0x100 + crt_regs[15];
        cursor_add ^= 0x2000;
        cursor_add += 0x7400;             // calculate actual address
        // move the cursor to the relevant place
        if (cursor_add < screen_start) cursor_add += 0x400;// deal with hardware wraparound
        cursor_add -= screen_start;

        gotoxy(cursor_add % 40 + 1, cursor_add / 40 + 1);
    }

    else {                                      // if in a graphics mode
        cursor_add = 0x100 * crt_regs[14] + crt_regs[15];
        cursor_add <<= 3;                 // calculte the actual address
        // deal with hardware wrap around
        if (cursor_add >= 0x8000) cursor_add -= 0x8000 - ram_screen_start;

        switch (vid_con_reg & 0x60) {     // get the cursor width in bytes
            case 0x60:
                cursor_wid = 4;
                break;
            case 0x40:
                cursor_wid = 2;
                break;
            case 0x20:
                puts("Invalid Cursor");
                exit(1);
                break;
            case 0x00:
                cursor_wid = 1;
                break;
        }


        switch (old_cursor_wid) {       // remove the old cursor

            case 4:
                screen_byte_P(RAM[old_cursor_add + 0x1F], old_cursor_add + 0x1F);
                screen_byte_P(RAM[old_cursor_add + 0x17], old_cursor_add + 0x17);

            case 2:
                screen_byte_P(RAM[old_cursor_add + 0x0F], old_cursor_add + 0x0F);
            case 1:
                screen_byte_P(RAM[old_cursor_add + 0x07], old_cursor_add + 0x07);
        }

        switch (cursor_wid) {           // position the new cursor

            case 4:
                screen_byte_P(0xFF, cursor_add + 0x1F);
                screen_byte_P(0xFF, cursor_add + 0x17);
            case 2:
                screen_byte_P(0xFF, cursor_add + 0x0F);
            case 1:
                screen_byte_P(0xFF, cursor_add + 0x07);
        }


        old_cursor_wid = cursor_wid;      // store a copy of the current cursor
        old_cursor_add = cursor_add;      //
    }

}